

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::fixup(QDateTimeEdit *this,QString *input)

{
  QString *input_00;
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QDateTime value;
  int copy;
  State state;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  input_00 = *(QString **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  state = 0xaaaaaaaa;
  copy = QLineEdit::cursorPosition((QLineEdit *)input_00[0x25].d.d);
  _value = &DAT_aaaaaaaaaaaaaaaa;
  QDateTimeEditPrivate::validateAndInterpret
            ((QDateTimeEditPrivate *)&value,input_00,(int *)input,(State *)&copy,SUB81(&state,0));
  if ((int)input_00[0x27].d.size == 1) {
    (**(code **)(*(long *)&(this->super_QAbstractSpinBox).super_QWidget + 0x1d8))
              (&local_58,this,&value);
    pDVar2 = (input->d).d;
    pcVar3 = (input->d).ptr;
    (input->d).d = local_58.d;
    (input->d).ptr = local_58.ptr;
    qVar1 = (input->d).size;
    (input->d).size = local_58.size;
    local_58.d = pDVar2;
    local_58.ptr = pcVar3;
    local_58.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  QDateTime::~QDateTime(&value);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::fixup(QString &input) const
{
    Q_D(const QDateTimeEdit);
    QValidator::State state;
    int copy = d->edit->cursorPosition();

    QDateTime value = d->validateAndInterpret(input, copy, state, true);
    // CorrectToPreviousValue correction is handled by QAbstractSpinBox.
    // The value might not match the input if the input represents a date-time
    // skipped over by its time representation, such as a spring-forward.
    if (d->correctionMode == QAbstractSpinBox::CorrectToNearestValue)
        input = textFromDateTime(value);
}